

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall GameEngine::applyLifeCycles(GameEngine *this)

{
  bool bVar1;
  __shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *this_02;
  element_type *this_03;
  element_type *this_04;
  shared_ptr<Population> local_60;
  __shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_50;
  shared_ptr<Population> *population;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__range2;
  shared_ptr<Player> *player;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *__range1;
  GameEngine *this_local;
  
  __end1 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::begin
                     (&this->players);
  player = (shared_ptr<Player> *)
           std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::end
                     (&this->players);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
                                *)&player);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
              ::operator*(&__end1);
    this_01 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        (this_00);
    this_02 = Player::GetPlayerPopulations(this_01);
    __end2 = std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
             ::begin(this_02);
    population = (shared_ptr<Population> *)
                 std::
                 vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                 ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                                  *)&population);
      if (!bVar1) break;
      local_50 = (__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                 ::operator*(&__end2);
      this_03 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(local_50);
      Population::SetAvailableStep(this_03,1);
      this_04 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           this);
      std::shared_ptr<Population>::shared_ptr(&local_60,(shared_ptr<Population> *)local_50);
      Map::applyLifeCircle(this_04,&local_60);
      std::shared_ptr<Population>::~shared_ptr(&local_60);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void GameEngine::applyLifeCycles() {
  for (auto &player : players) {
    for (auto &population : player->GetPlayerPopulations()) {
      population->SetAvailableStep(1);
      map->applyLifeCircle(population);
    }
  }
}